

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O1

ANNkd_ptr rkd_tree(ANNpointArray pa,ANNidxArray pidx,int n,int dim,int bsp,ANNorthRect *bnd_box,
                  ANNkd_splitter splitter)

{
  _func_int **pp_Var1;
  ANNcoord AVar2;
  ANNidxArray pAVar3;
  _func_int **pp_Var4;
  ANNcoord AVar5;
  ANNidxArray pAVar6;
  int iVar7;
  ANNpoint pAVar8;
  ANNpoint pAVar9;
  long lVar10;
  ANNkd_ptr pAVar11;
  ANNkd_leaf *pAVar12;
  ANNcoord cv;
  int cd;
  int n_lo;
  ANNidxArray local_60;
  int local_54;
  _func_int **local_50;
  ANNcoord local_48;
  ANNkd_ptr local_40;
  int local_34;
  
  if (bsp < n) {
    (*splitter)(pa,pidx,bnd_box,n,dim,&local_54,(ANNcoord *)&local_60,&local_34);
    lVar10 = (long)local_54;
    local_50 = (_func_int **)bnd_box->lo[lVar10];
    local_48 = bnd_box->hi[lVar10];
    bnd_box->hi[lVar10] = (ANNcoord)local_60;
    local_40 = rkd_tree(pa,pidx,local_34,dim,bsp,bnd_box,splitter);
    bnd_box->hi[local_54] = local_48;
    bnd_box->lo[local_54] = (ANNcoord)local_60;
    pAVar11 = rkd_tree(pa,pidx + local_34,n - local_34,dim,bsp,bnd_box,splitter);
    pAVar8 = bnd_box->lo;
    lVar10 = (long)local_54;
    pAVar8[lVar10] = (ANNcoord)local_50;
    if (TreeTopology[lVar10] == 3) {
      iVar7 = TreeP3Topology[lVar10];
      pAVar12 = (ANNkd_leaf *)TreeP3Topology;
      if (iVar7 == 0) {
        pAVar12 = (ANNkd_leaf *)operator_new(0x78);
        pp_Var1 = (_func_int **)pAVar8[lVar10 + 1];
        pAVar9 = bnd_box->hi;
        AVar2 = pAVar9[lVar10 + 1];
        pAVar3 = (ANNidxArray)pAVar8[lVar10 + 2];
        pp_Var4 = (_func_int **)pAVar9[lVar10 + 2];
        AVar5 = pAVar8[lVar10 + 3];
        pAVar6 = (ANNidxArray)pAVar9[lVar10 + 3];
        (pAVar12->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010ad68;
        pAVar12->n_pts = local_54;
        pAVar12->bkt = local_60;
        pAVar12[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
        *(ANNcoord *)&pAVar12[1].n_pts = local_48;
        pAVar12[1].bkt = (ANNidxArray)local_40;
        pAVar12[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar11;
        pAVar12[2].n_pts = local_54 + 1;
        *(int *)&pAVar12[2].field_0xc = local_54 + 2;
        *(int *)&pAVar12[2].bkt = local_54 + 3;
        pAVar12[3].super_ANNkd_node._vptr_ANNkd_node = pp_Var1;
        *(ANNcoord *)&pAVar12[3].n_pts = AVar2;
        pAVar12[3].bkt = pAVar3;
        pAVar12[4].super_ANNkd_node._vptr_ANNkd_node = pp_Var4;
        *(ANNcoord *)&pAVar12[4].n_pts = AVar5;
        pAVar12[4].bkt = pAVar6;
      }
      if (iVar7 == 1) {
        pAVar12 = (ANNkd_leaf *)operator_new(0x78);
        pp_Var1 = (_func_int **)pAVar8[lVar10 + -1];
        pAVar9 = bnd_box->hi;
        AVar2 = pAVar9[lVar10 + -1];
        pAVar3 = (ANNidxArray)pAVar8[lVar10 + 1];
        pp_Var4 = (_func_int **)pAVar9[lVar10 + 1];
        AVar5 = pAVar8[lVar10 + 2];
        pAVar6 = (ANNidxArray)pAVar9[lVar10 + 2];
        (pAVar12->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010ad68;
        pAVar12->n_pts = local_54;
        pAVar12->bkt = local_60;
        pAVar12[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
        *(ANNcoord *)&pAVar12[1].n_pts = local_48;
        pAVar12[1].bkt = (ANNidxArray)local_40;
        pAVar12[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar11;
        pAVar12[2].n_pts = local_54 + -1;
        *(int *)&pAVar12[2].field_0xc = local_54 + 1;
        *(int *)&pAVar12[2].bkt = local_54 + 2;
        pAVar12[3].super_ANNkd_node._vptr_ANNkd_node = pp_Var1;
        *(ANNcoord *)&pAVar12[3].n_pts = AVar2;
        pAVar12[3].bkt = pAVar3;
        pAVar12[4].super_ANNkd_node._vptr_ANNkd_node = pp_Var4;
        *(ANNcoord *)&pAVar12[4].n_pts = AVar5;
        pAVar12[4].bkt = pAVar6;
      }
      if (iVar7 == 2) {
        pAVar12 = (ANNkd_leaf *)operator_new(0x78);
        pp_Var1 = (_func_int **)pAVar8[lVar10 + -2];
        pAVar9 = bnd_box->hi;
        AVar2 = pAVar9[lVar10 + -2];
        pAVar3 = (ANNidxArray)pAVar8[lVar10 + -1];
        pp_Var4 = (_func_int **)pAVar9[lVar10 + -1];
        AVar5 = pAVar8[lVar10 + 1];
        pAVar6 = (ANNidxArray)pAVar9[lVar10 + 1];
        (pAVar12->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010ad68;
        pAVar12->n_pts = local_54;
        pAVar12->bkt = local_60;
        pAVar12[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
        *(ANNcoord *)&pAVar12[1].n_pts = local_48;
        pAVar12[1].bkt = (ANNidxArray)local_40;
        pAVar12[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar11;
        pAVar12[2].n_pts = local_54 + -2;
        *(int *)&pAVar12[2].field_0xc = local_54 + -1;
        *(int *)&pAVar12[2].bkt = local_54 + 1;
        pAVar12[3].super_ANNkd_node._vptr_ANNkd_node = pp_Var1;
        *(ANNcoord *)&pAVar12[3].n_pts = AVar2;
        pAVar12[3].bkt = pAVar3;
        pAVar12[4].super_ANNkd_node._vptr_ANNkd_node = pp_Var4;
        *(ANNcoord *)&pAVar12[4].n_pts = AVar5;
        pAVar12[4].bkt = pAVar6;
      }
      if (iVar7 == 3) {
        pAVar12 = (ANNkd_leaf *)operator_new(0x78);
        pp_Var1 = (_func_int **)pAVar8[lVar10 + -3];
        pAVar9 = bnd_box->hi;
        AVar2 = pAVar9[lVar10 + -3];
        pAVar3 = (ANNidxArray)pAVar8[lVar10 + -2];
        pp_Var4 = (_func_int **)pAVar9[lVar10 + -2];
        AVar5 = pAVar8[lVar10 + -1];
        pAVar6 = (ANNidxArray)pAVar9[lVar10 + -1];
        (pAVar12->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010ad68;
        pAVar12->n_pts = local_54;
        pAVar12->bkt = local_60;
        pAVar12[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
        *(ANNcoord *)&pAVar12[1].n_pts = local_48;
        pAVar12[1].bkt = (ANNidxArray)local_40;
        pAVar12[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar11;
        pAVar12[2].n_pts = local_54 + -3;
        *(int *)&pAVar12[2].field_0xc = local_54 + -2;
        *(int *)&pAVar12[2].bkt = local_54 + -1;
        pAVar12[3].super_ANNkd_node._vptr_ANNkd_node = pp_Var1;
        *(ANNcoord *)&pAVar12[3].n_pts = AVar2;
        pAVar12[3].bkt = pAVar3;
        pAVar12[4].super_ANNkd_node._vptr_ANNkd_node = pp_Var4;
        *(ANNcoord *)&pAVar12[4].n_pts = AVar5;
        pAVar12[4].bkt = pAVar6;
      }
    }
    else {
      pAVar12 = (ANNkd_leaf *)operator_new(0x78);
      (pAVar12->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010ad68;
      pAVar12->n_pts = local_54;
      pAVar12->bkt = local_60;
      pAVar12[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
      *(ANNcoord *)&pAVar12[1].n_pts = local_48;
      pAVar12[1].bkt = (ANNidxArray)local_40;
      pAVar12[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar11;
    }
  }
  else {
    pAVar12 = KD_TRIVIAL;
    if (n != 0) {
      pAVar12 = (ANNkd_leaf *)operator_new(0x18);
      (pAVar12->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_node_0010ad28;
      pAVar12->n_pts = n;
      pAVar12->bkt = pidx;
    }
  }
  return &pAVar12->super_ANNkd_node;
}

Assistant:

ANNkd_ptr rkd_tree(           // recursive construction of kd-tree
    ANNpointArray pa,         // point array
    ANNidxArray pidx,         // point indices to store in subtree
    int n,                    // number of points
    int dim,                  // dimension of space
    int bsp,                  // bucket space
    ANNorthRect &bnd_box,     // bounding box for current node
    ANNkd_splitter splitter)  // splitting routine
{
    if (n <= bsp) {             // n small, make a leaf node
        if (n == 0)             // empty leaf node
            return KD_TRIVIAL;  // return (canonical) empty leaf
        else                    // construct the node and return
            return new ANNkd_leaf(n, pidx);
    } else {                  // n large, make a splitting node
        int cd;               // cutting dimension
        ANNcoord cv;          // cutting value
        int n_lo;             // number on low side of cut
        ANNkd_node *lo, *hi;  // low and high children

        // invoke splitting procedure
        (*splitter)(pa, pidx, bnd_box, n, dim, cd, cv, n_lo);

        ANNcoord lv = bnd_box.lo[cd];  // save bounds for cutting dimension
        ANNcoord hv = bnd_box.hi[cd];

        bnd_box.hi[cd] = cv;  // modify bounds for left subtree
        lo = rkd_tree(        // build left subtree
            pa, pidx, n_lo,   // ...from pidx[0..n_lo-1]
            dim, bsp, bnd_box, splitter);
        bnd_box.hi[cd] = hv;  // restore bounds

        bnd_box.lo[cd] = cv;            // modify bounds for right subtree
        hi = rkd_tree(                  // build right subtree
            pa, pidx + n_lo, n - n_lo,  // ...from pidx[n_lo..n-1]
            dim, bsp, bnd_box, splitter);
        bnd_box.lo[cd] = lv;  // restore bounds

        // create the splitting node
        ANNkd_split *ptr;
        if (TreeTopology[cd] == 3) {
            if (TreeP3Topology[cd] == 0)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd + 1, cd + 2, cd + 3, bnd_box.lo[cd + 1],
                    bnd_box.hi[cd + 1], bnd_box.lo[cd + 2], bnd_box.hi[cd + 2],
                    bnd_box.lo[cd + 3], bnd_box.hi[cd + 3], lo, hi);
            if (TreeP3Topology[cd] == 1)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 1, cd + 1, cd + 2, bnd_box.lo[cd - 1],
                    bnd_box.hi[cd - 1], bnd_box.lo[cd + 1], bnd_box.hi[cd + 1],
                    bnd_box.lo[cd + 2], bnd_box.hi[cd + 2], lo, hi);
            if (TreeP3Topology[cd] == 2)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 2, cd - 1, cd + 1, bnd_box.lo[cd - 2],
                    bnd_box.hi[cd - 2], bnd_box.lo[cd - 1], bnd_box.hi[cd - 1],
                    bnd_box.lo[cd + 1], bnd_box.hi[cd + 1], lo, hi);
            if (TreeP3Topology[cd] == 3)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 3, cd - 2, cd - 1, bnd_box.lo[cd - 3],
                    bnd_box.hi[cd - 3], bnd_box.lo[cd - 2], bnd_box.hi[cd - 2],
                    bnd_box.lo[cd - 1], bnd_box.hi[cd - 1], lo, hi);
        } else {
            ptr = new ANNkd_split(cd, cv, lv, hv, lo, hi);
        }

        return ptr;  // return pointer to this node
    }
}